

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall crnlib::symbol_codec::decode_rice(symbol_codec *this,uint m)

{
  uint uVar1;
  uint r;
  uint l;
  uint k;
  uint q;
  uint m_local;
  symbol_codec *this_local;
  
  l = 0;
  do {
    uVar1 = decode_peek_bits(this,0x10);
    uVar1 = utils::count_leading_zeros16((uVar1 ^ 0xffffffff) & 0xffff);
    l = uVar1 + l;
    decode_remove_bits(this,uVar1);
  } while (0xf < uVar1);
  decode_remove_bits(this,1);
  uVar1 = decode_bits(this,m);
  return (l << ((byte)m & 0x1f)) + uVar1;
}

Assistant:

uint symbol_codec::decode_rice(uint m)
    {
        CRNLIB_ASSERT(m > 0);

        uint q = 0;

        for (;;)
        {
            uint k = decode_peek_bits(16);

            uint l = utils::count_leading_zeros16((~k) & 0xFFFF);

            q += l;

            decode_remove_bits(l);

            if (l < 16)
            {
                break;
            }
        }

        decode_remove_bits(1);

        uint r = decode_bits(m);

        return (q << m) + r;
    }